

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesElementWildcard.cpp
# Opt level: O2

bool xercesc_4_0::XercesElementWildcard::wildcardIntersect
               (NodeTypes t1,uint w1,NodeTypes t2,uint w2)

{
  NodeTypes NVar1;
  NodeTypes NVar2;
  bool bVar3;
  
  NVar2 = t1 & (Any_NS|Any_Other);
  bVar3 = true;
  if ((NVar2 != Any) && (NVar1 = t2 & (Any_NS|Any_Other), NVar1 != Any)) {
    if ((NVar2 ^ Any_NS) == Leaf && (NVar1 ^ Any_NS) == Leaf) {
      bVar3 = w1 == w2;
    }
    else if ((NVar2 ^ Any_Other) != Leaf || (NVar1 ^ Any_Other) != Leaf) {
      if ((NVar2 ^ Any_NS) == Leaf && (NVar1 ^ Any_Other) == Leaf) {
        return w1 != 1 && w1 != w2;
      }
      if ((NVar2 ^ Any_Other) == Leaf && (NVar1 ^ Any_NS) == Leaf) {
        return w2 != 1 && w1 != w2;
      }
      return false;
    }
  }
  return bVar3;
}

Assistant:

bool XercesElementWildcard::wildcardIntersect(ContentSpecNode::NodeTypes t1,
                                              unsigned int               w1,
                                              ContentSpecNode::NodeTypes t2,
                                              unsigned int               w2)
{
    if (((t1 & 0x0f) == ContentSpecNode::Any) ||
        ((t2 & 0x0f) == ContentSpecNode::Any)) {
        // if either one is "##any", then intersects
        return true;
    }
    else if (((t1 & 0x0f) == ContentSpecNode::Any_NS) &&
             ((t2 & 0x0f) == ContentSpecNode::Any_NS)) {
        // if both are "some_namespace" and equal, then intersects
        return w1 == w2;
    }
    else if (((t1 & 0x0f) == ContentSpecNode::Any_Other) &&
             ((t2 & 0x0f) == ContentSpecNode::Any_Other)) {
        // if both are "##other", then intersects
        return true;
    }
    // Below we assume that empty string has id 1.
    //
    else if (((t1 & 0x0f) == ContentSpecNode::Any_NS) &&
             ((t2 & 0x0f) == ContentSpecNode::Any_Other))
    {
      return w1 != w2 && w1 != 1;
    }
    else if (((t1 & 0x0f) == ContentSpecNode::Any_Other) &&
             ((t2 & 0x0f) == ContentSpecNode::Any_NS))
    {
      return w1 != w2 && w2 != 1;
    }
    return false;
}